

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::OneofDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,OneofDescriptor *this,DebugStringOptions *options)

{
  DebugStringOptions *options_local;
  OneofDescriptor *this_local;
  string *contents;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  DebugString(this,0,__return_storage_ptr__,options);
  return __return_storage_ptr__;
}

Assistant:

std::string OneofDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options);
  return contents;
}